

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_begin_object(basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
                  size_t length,semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  size_t local_28;
  ubjson_container_type local_1c;
  
  iVar1 = this->nesting_depth_;
  this->nesting_depth_ = iVar1 + 1;
  local_28 = length;
  if (iVar1 < *(int *)((this->options_)._vptr_ubjson_encode_options[-3] + 8 +
                      (long)&(this->options_)._vptr_ubjson_encode_options)) {
    local_1c = object;
    std::
    vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
    ::emplace_back<jsoncons::ubjson::ubjson_container_type,unsigned_long&>
              ((vector<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item,std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>::stack_item>>
                *)&this->stack_,&local_1c,&local_28);
    binary_stream_sink::push_back(&this->sink_,'{');
    binary_stream_sink::push_back(&this->sink_,'#');
    put_length(this,local_28);
  }
  else {
    std::error_code::operator=(ec,max_nesting_depth_exceeded);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_object(std::size_t length, semantic_tag, const ser_context&, std::error_code& ec) override
    {
        if (JSONCONS_UNLIKELY(++nesting_depth_ > options_.max_nesting_depth()))
        {
            ec = ubjson_errc::max_nesting_depth_exceeded;
            JSONCONS_VISITOR_RETURN;
        } 
        stack_.emplace_back(ubjson_container_type::object, length);
        sink_.push_back(jsoncons::ubjson::ubjson_type::start_object_marker);
        sink_.push_back(jsoncons::ubjson::ubjson_type::count_marker);
        put_length(length);

        JSONCONS_VISITOR_RETURN;
    }